

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSieve.cpp
# Opt level: O2

void __thiscall primesieve::ParallelSieve::sieve(ParallelSieve *this)

{
  future<primesieve::Array<unsigned_long,_6UL>_> *pfVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int threads;
  int iVar3;
  uint64_t uVar4;
  pointer p_Var5;
  _Result<primesieve::Array<unsigned_long,_6UL>_> *p_Var6;
  future<primesieve::Array<unsigned_long,_6UL>_> *f;
  future<primesieve::Array<unsigned_long,_6UL>_> *this_00;
  long lVar7;
  _State_baseV2 *__tmp;
  int iVar8;
  bool bVar9;
  __allocator_type __a2;
  __state_type local_f8;
  __allocator_type __a2_1;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  futures;
  __basic_future<primesieve::Array<unsigned_long,_6UL>_> local_b8;
  atomic<unsigned_long> a;
  uint64_t iters;
  uint64_t threadDist;
  Array<unsigned_long,_6UL> local_88;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  long local_40;
  thread local_38;
  
  PrimeSieve::reset(&this->super_PrimeSieve);
  if ((this->super_PrimeSieve).start_ <= (this->super_PrimeSieve).stop_) {
    threads = idealNumThreads(this);
    if (threads == 1) {
      PrimeSieve::sieve(&this->super_PrimeSieve);
      return;
    }
    PrimeSieve::setStatus(&this->super_PrimeSieve,0.0);
    local_40 = std::chrono::_V2::system_clock::now();
    uVar4 = PrimeSieve::getDistance(&this->super_PrimeSieve);
    threadDist = getThreadDistance(this,threads);
    iters = (uVar4 - 1) / threadDist + 1;
    iVar3 = (int)iters;
    if ((ulong)(long)threads <= iters) {
      iVar3 = threads;
    }
    iVar8 = 1;
    if (threads != 0) {
      iVar8 = iVar3;
    }
    a.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    futures.array_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    futures.end_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    futures.capacity_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
    ::reserve(&futures,(long)iVar8);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    while (pfVar1 = futures.end_, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (pointer)operator_new(0x68);
      local_88.array_[0] = (unsigned_long)&__a2;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0017c7c0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var5->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_0017c810;
      local_88.array_[1] = (unsigned_long)p_Var5;
      p_Var6 = (_Result<primesieve::Array<unsigned_long,_6UL>_> *)operator_new(0x48);
      std::__future_base::_Result<primesieve::Array<unsigned_long,_6UL>_>::_Result(p_Var6);
      *(_Result<primesieve::Array<unsigned_long,_6UL>_> **)
       ((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = p_Var6;
      *(ParallelSieve **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) = this;
      *(atomic<unsigned_long> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = &a;
      *(uint64_t **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x48) = &iters;
      *(uint64_t **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x50) = &threadDist;
      local_38._M_id._M_thread = (id)0;
      ___a2_1 = (long *)operator_new(0x20);
      *___a2_1 = (long)&PTR___State_0017c868;
      ___a2_1[1] = (long)&p_Var5->_M_impl;
      ___a2_1[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>
                         ::_M_run;
      ___a2_1[3] = 0;
      std::thread::_M_start_thread(&local_38,&__a2_1,0);
      if (___a2_1 != (long *)0x0) {
        (**(code **)(*___a2_1 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20),&local_38);
      std::thread::~thread(&local_38);
      local_88.array_[1] = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kimwalisch[P]primecount_lib_primesieve_src_ParallelSieve_cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kimwalisch[P]primecount_lib_primesieve_src_ParallelSieve_cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_88);
      local_58 = 0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.array_[0] =
           (unsigned_long)
           local_f8.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.array_[1] =
           (unsigned_long)
           local_f8.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var5->_M_impl;
      local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88.array_ + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
      if (local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var5 = (pointer)operator_new(0x58);
        local_88.array_[0] = (unsigned_long)&__a2_1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_0017c8a8;
        *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_0017c8f8;
        local_88.array_[1] = (unsigned_long)p_Var5;
        p_Var6 = (_Result<primesieve::Array<unsigned_long,_6UL>_> *)operator_new(0x48);
        std::__future_base::_Result<primesieve::Array<unsigned_long,_6UL>_>::_Result(p_Var6);
        *(_Result<primesieve::Array<unsigned_long,_6UL>_> **)
         ((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = p_Var6;
        *(ParallelSieve **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = this;
        *(atomic<unsigned_long> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = &a;
        *(uint64_t **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) = &iters;
        *(uint64_t **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = &threadDist;
        local_88.array_[1] = 0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kimwalisch[P]primecount_lib_primesieve_src_ParallelSieve_cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kimwalisch[P]primecount_lib_primesieve_src_ParallelSieve_cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_88);
        local_58 = 0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88.array_[0] =
             (unsigned_long)
             local_f8.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_88.array_[1] =
             (unsigned_long)
             local_f8.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var5->_M_impl;
        local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88.array_ + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
      }
      std::__basic_future<primesieve::Array<unsigned_long,_6UL>_>::__basic_future
                (&local_b8,&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (futures.end_ == futures.capacity_) {
        lVar7 = (long)futures.end_ - (long)futures.array_ >> 3;
        Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
        ::reserve_unchecked(&futures,lVar7 + (ulong)(lVar7 == 0));
      }
      _Var2._M_pi = local_b8._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      ((futures.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((futures.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_b8._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ((futures.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      local_b8._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      futures.end_ = futures.end_ + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b8._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    for (this_00 = futures.array_; this_00 != pfVar1; this_00 = this_00 + 1) {
      std::future<primesieve::Array<unsigned_long,_6UL>_>::get(&local_88,this_00);
      anon_unknown.dwarf_1473ac::operator+=(&(this->super_PrimeSieve).counts_,&local_88);
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    (this->super_PrimeSieve).seconds_ = (double)(lVar7 - local_40) / 1000000000.0;
    PrimeSieve::setStatus(&this->super_PrimeSieve,100.0);
    Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
    ::~Vector(&futures);
  }
  return;
}

Assistant:

void ParallelSieve::sieve()
{
  reset();

  if (start_ > stop_)
    return;

  int threads = idealNumThreads();

  if (threads == 1)
    PrimeSieve::sieve();
  else
  {
    setStatus(0);
    auto t1 = std::chrono::system_clock::now();
    uint64_t dist = getDistance();
    uint64_t threadDist = getThreadDistance(threads);
    uint64_t iters = ((dist - 1) / threadDist) + 1;
    threads = inBetween(1, threads, iters);
    std::atomic<uint64_t> a(0);

    // Each thread executes 1 task
    auto task = [&]()
    {
      PrimeSieve ps(this);
      uint64_t i;
      counts_t counts;
      counts.fill(0);

      while ((i = a.fetch_add(1, std::memory_order_relaxed)) < iters)
      {
        uint64_t start = start_ + threadDist * i;
        uint64_t stop = checkedAdd(start, threadDist);
        stop = align(stop);

        if (start > start_)
          start = align(start) + 1;

        // Sieve the primes inside [start, stop]
        ps.sieve(start, stop);
        counts += ps.getCounts();
      }

      return counts;
    };

    Vector<std::future<counts_t>> futures;
    futures.reserve(threads);

    for (int t = 0; t < threads; t++)
      futures.emplace_back(std::async(std::launch::async, task));

    for (auto& f : futures)
      counts_ += f.get();

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    seconds_ = seconds.count();
    setStatus(100);
  }
}